

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O3

bool __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  OfType OVar1;
  tuple<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  os;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar2;
  size_t sVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer pMVar7;
  MessageInfo *messageInfo;
  pointer pMVar8;
  char *pcVar9;
  ReusableStringStream msg;
  string local_a8;
  string local_88;
  string local_68;
  ReusableStringStream local_48;
  
  if ((((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok) ||
     (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0))
  goto LAB_001453a1;
  local_48.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_00313ea8;
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar3 = StringStreams::add(&pSVar2->super_StringStreams);
  local_48.m_index = sVar3;
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  os.
  super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       *(_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&(pSVar2->super_StringStreams).m_streams.
            super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar3]._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  local_48.m_oss =
       (ostream *)
       os.
       super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((this->super_StreamingReporterBase<Catch::TeamCityReporter>).field_0x162 == '\0') {
    printSectionHeader(this,(ostream *)
                            os.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  (this->super_StreamingReporterBase<Catch::TeamCityReporter>).field_0x162 = 1;
  local_a8._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_a8._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<((ostream *)
                    os.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl,(SourceLineInfo *)&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             os.
             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,"\n",1);
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  uVar6 = (ulong)(uint)OVar1;
  if (OVar1 < ThrewException) {
    if (FailureBit < OVar1) {
      if (OVar1 == ExpressionFailed) {
        pcVar9 = "expression failed";
      }
      else {
        if (OVar1 != ExplicitFailure) {
          if (OVar1 == Exception) goto LAB_00144f5f;
          goto LAB_00144fe4;
        }
        uVar6 = 0x10;
        pcVar9 = "explicit failure";
      }
      goto LAB_00144fdc;
    }
    if ((uint)OVar1 < 3) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_88);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_88.field_2._M_allocated_capacity,
                 "Internal error in TeamCity reporter",0x23);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a8);
    }
    if ((OVar1 == Unknown) || (OVar1 == FailureBit)) {
LAB_00144f5f:
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_88);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_88.field_2._M_allocated_capacity,"Not implemented",0xf);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a8);
    }
  }
  else {
    if (OVar1 == ThrewException) {
      uVar6 = 0x14;
      pcVar9 = "unexpected exception";
    }
    else if (OVar1 == DidntThrowException) {
      uVar6 = 0x2e;
      pcVar9 = "no exception was thrown where one was expected";
    }
    else {
      if (OVar1 != FatalErrorCondition) goto LAB_00144fe4;
      uVar6 = 0x15;
      pcVar9 = "fatal error condition";
    }
LAB_00144fdc:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,pcVar9,uVar6);
  }
LAB_00144fe4:
  pMVar8 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar7 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pMVar7 - (long)pMVar8;
  if (lVar4 == 0x48) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl," with message:",0xe);
    pMVar8 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar7 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar4 = (long)pMVar7 - (long)pMVar8;
  }
  if (1 < (ulong)((lVar4 >> 3) * -0x71c71c71c71c71c7)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl," with messages:",0xf);
    pMVar8 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar7 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; pMVar8 != pMVar7; pMVar8 = pMVar8 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\n  \"",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,(pMVar8->message)._M_dataplus._M_p,(pMVar8->message)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\"",1);
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\n  ",3);
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_a8,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\nwith expansion:\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"  ",2);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_88,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  if ((((this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
        super_Option<Catch::TestCaseInfo>.nullableValue)->properties & (MayFail|ShouldFail)) == None
     ) {
    poVar5 = (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"##teamcity[testFailed",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," name=\'",7);
    escape(&local_a8,
           &((this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
             super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," message=\'",10);
    std::__cxx11::stringbuf::str();
    escape(&local_88,&local_68);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"- failure ignore as test marked as \'ok to fail\'\n",0x30);
    poVar5 = (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"##teamcity[testIgnored",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," name=\'",7);
    escape(&local_a8,
           &((this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
             super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," message=\'",10);
    std::__cxx11::stringbuf::str();
    escape(&local_88,&local_68);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  ReusableStringStream::~ReusableStringStream(&local_48);
LAB_001453a1:
  std::ostream::flush();
  return true;
}

Assistant:

bool assertionEnded( AssertionStats const& assertionStats ) override {
            AssertionResult const& result = assertionStats.assertionResult;
            if( !result.isOk() ) {

                ReusableStringStream msg;
                if( !m_headerPrintedForThisSection )
                    printSectionHeader( msg.get() );
                m_headerPrintedForThisSection = true;

                msg << result.getSourceInfo() << "\n";

                switch( result.getResultType() ) {
                    case ResultWas::ExpressionFailed:
                        msg << "expression failed";
                        break;
                    case ResultWas::ThrewException:
                        msg << "unexpected exception";
                        break;
                    case ResultWas::FatalErrorCondition:
                        msg << "fatal error condition";
                        break;
                    case ResultWas::DidntThrowException:
                        msg << "no exception was thrown where one was expected";
                        break;
                    case ResultWas::ExplicitFailure:
                        msg << "explicit failure";
                        break;

                    // We shouldn't get here because of the isOk() test
                    case ResultWas::Ok:
                    case ResultWas::Info:
                    case ResultWas::Warning:
                        CATCH_ERROR( "Internal error in TeamCity reporter" );
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        CATCH_ERROR( "Not implemented" );
                }
                if( assertionStats.infoMessages.size() == 1 )
                    msg << " with message:";
                if( assertionStats.infoMessages.size() > 1 )
                    msg << " with messages:";
                for( auto const& messageInfo : assertionStats.infoMessages )
                    msg << "\n  \"" << messageInfo.message << "\"";


                if( result.hasExpression() ) {
                    msg <<
                        "\n  " << result.getExpressionInMacro() << "\n"
                        "with expansion:\n" <<
                        "  " << result.getExpandedExpression() << "\n";
                }

                if( currentTestCaseInfo->okToFail() ) {
                    msg << "- failure ignore as test marked as 'ok to fail'\n";
                    stream << "##teamcity[testIgnored"
                           << " name='" << escape( currentTestCaseInfo->name )<< "'"
                           << " message='" << escape( msg.str() ) << "'"
                           << "]\n";
                }
                else {
                    stream << "##teamcity[testFailed"
                           << " name='" << escape( currentTestCaseInfo->name )<< "'"
                           << " message='" << escape( msg.str() ) << "'"
                           << "]\n";
                }
            }
            stream.flush();
            return true;
        }